

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.c
# Opt level: O3

int undo(int f,int n)

{
  anon_enum_32 aVar1;
  buffer *pbVar2;
  undo_rec **ppuVar3;
  line *plVar4;
  int iVar5;
  mgwin *pmVar6;
  int iVar7;
  int iVar8;
  buffer *pbVar9;
  buffer *rec;
  buffer *buf;
  uint uVar10;
  int iVar11;
  
  buf = (buffer *)(ulong)(uint)f;
  pbVar9 = (buffer *)(ulong)(uint)n;
  if (n < 0) {
    iVar11 = 0;
  }
  else {
    rec = (buffer *)curbp->b_undoptr;
    if (((undo_nulled & rec == (buffer *)0x0) != 0) || (rptcount == 0)) {
      rec = (buffer *)(curbp->b_undo).tqh_first;
      undo_nulled = 1;
    }
    iVar11 = 1;
    while (n != 0) {
      if (rec == (buffer *)0x0) {
LAB_00119eca:
        dobeep();
        rec = (buffer *)0x0;
        ewprintf("No further undo information");
        undo_nulled = 1;
        iVar11 = 0;
        break;
      }
      aVar1 = *(anon_enum_32 *)&rec->b_altb;
      while (aVar1 == BOUNDARY) {
        pbVar2 = (rec->b_list).l_p.x_bp;
        ppuVar3 = (undo_rec **)(rec->b_list).l_name;
        if (pbVar2 == (buffer *)0x0) {
          (curbp->b_undo).tqh_last = ppuVar3;
          *ppuVar3 = (undo_rec *)0x0;
          free_undo_record((undo_rec *)rec);
          goto LAB_00119eca;
        }
        (pbVar2->b_list).l_name = (char *)ppuVar3;
        *ppuVar3 = (undo_rec *)pbVar2;
        free_undo_record((undo_rec *)rec);
        buf = rec;
        rec = pbVar2;
        aVar1 = *(anon_enum_32 *)&pbVar2->b_altb;
      }
      n = n + -1;
      undo_nulled = 0;
      undo_add_boundary((int)buf,(int)pbVar9);
      iVar5 = boundary_flag;
      boundary_flag = 0;
      do {
        pmVar6 = curwp;
        aVar1 = *(anon_enum_32 *)&rec->b_altb;
        if (1 < aVar1 - BOUNDARY) {
          iVar7 = *(int *)rec->b_modes;
          pbVar9 = (buffer *)curbp->b_headp;
          uVar10 = *(uint *)((long)&pbVar9->b_altb + 4);
          iVar8 = 0;
          buf = pbVar9;
          if ((int)uVar10 < iVar7) {
            iVar8 = 0;
            do {
              buf = (buffer *)(buf->b_list).l_p.l_wp;
              if (buf == pbVar9) {
                dobeep();
                iVar11 = 0;
                iVar7 = 0x1243c6;
                ewprintf("Internal error in Undo!");
                goto LAB_00119e89;
              }
              iVar7 = iVar7 + ~uVar10;
              iVar8 = iVar8 + 1;
              uVar10 = *(uint *)((long)&buf->b_altb + 4);
            } while ((int)uVar10 < iVar7);
          }
          curwp->w_dotp = (line *)buf;
          pmVar6->w_doto = iVar7;
          pmVar6->w_markline = pmVar6->w_dotline;
          pmVar6->w_dotline = iVar8;
          pbVar9 = (buffer *)pmVar6;
        }
        iVar7 = (int)buf;
        switch(aVar1) {
        case INSERT:
          buf = (buffer *)(ulong)*(uint *)&rec->b_headp;
          pbVar9 = (buffer *)0x0;
          ldelete(*(uint *)&rec->b_headp,0);
          break;
        case DELETE:
          plVar4 = curwp->w_dotp;
          iVar7 = curwp->w_doto;
          buf = (buffer *)rec->b_modes[1];
          pbVar9 = (buffer *)(ulong)*(uint *)&rec->b_headp;
          region_put_data((char *)buf,*(uint *)&rec->b_headp);
          pmVar6 = curwp;
          curwp->w_dotp = plVar4;
          pmVar6->w_doto = iVar7;
          break;
        case BOUNDARY:
          rec = (buffer *)(rec->b_list).l_p.l_wp;
          goto LAB_00119e89;
        case MODIFIED:
          curbp->b_flag = curbp->b_flag & 0xfe;
          break;
        case DELREG:
          buf = (buffer *)rec->b_modes[1];
          pbVar9 = (buffer *)(ulong)*(uint *)&rec->b_headp;
          region_put_data((char *)buf,*(uint *)&rec->b_headp);
        }
        iVar7 = (int)buf;
        rec = (buffer *)(rec->b_list).l_p.l_wp;
      } while (rec != (buffer *)0x0);
      rec = (buffer *)0x0;
LAB_00119e89:
      boundary_flag = iVar5;
      undo_add_boundary(iVar7,(int)pbVar9);
      buf = (buffer *)0x1243d8;
      ewprintf("Undo!");
    }
    curbp->b_undoptr = (undo_rec *)rec;
  }
  return iVar11;
}

Assistant:

int
undo(int f, int n)
{
	struct undo_rec	*ptr, *nptr;
	int		 done, rval;
	struct line	*lp;
	int		 offset, save;
	static int	 nulled = FALSE;
	int		 lineno;

	if (n < 0)
		return (FALSE);

	ptr = curbp->b_undoptr;

	/* first invocation, make ptr point back to the top of the list */
	if ((ptr == NULL && nulled == TRUE) ||  rptcount == 0) {
		ptr = TAILQ_FIRST(&curbp->b_undo);
		nulled = TRUE;
	}

	rval = TRUE;
	while (n--) {
		/* if we have a spurious boundary, free it and move on.... */
		while (ptr && ptr->type == BOUNDARY) {
			nptr = TAILQ_NEXT(ptr, next);
			TAILQ_REMOVE(&curbp->b_undo, ptr, next);
			free_undo_record(ptr);
			ptr = nptr;
		}
		/*
		 * Ptr is NULL, but on the next run, it will point to the
		 * top again, redoing all stuff done in the buffer since
		 * its creation.
		 */
		if (ptr == NULL) {
			dobeep();
			ewprintf("No further undo information");
			rval = FALSE;
			nulled = TRUE;
			break;
		}
		nulled = FALSE;

		/*
		 * Loop while we don't get a boundary specifying we've
		 * finished the current action...
		 */

		undo_add_boundary(FFRAND, 1);

		save = boundary_flag;
		boundary_flag = FALSE;

		done = 0;
		do {
			/*
			 * Move to where this has to apply
			 *
			 * Boundaries (and the modified flag)  are put as
			 * position 0 (to save lookup time in find_dot)
			 * so we must not move there...
			 */
			if (ptr->type != BOUNDARY && ptr->type != MODIFIED) {
				if (find_lo(ptr->pos, &lp,
				    &offset, &lineno) == FALSE) {
					dobeep();
					ewprintf("Internal error in Undo!");
					rval = FALSE;
					break;
				}
				curwp->w_dotp = lp;
				curwp->w_doto = offset;
				curwp->w_markline = curwp->w_dotline;
				curwp->w_dotline = lineno;
			}

			/*
			 * Do operation^-1
			 */
			switch (ptr->type) {
			case INSERT:
				ldelete(ptr->region.r_size, KNONE);
				break;
			case DELETE:
				lp = curwp->w_dotp;
				offset = curwp->w_doto;
				region_put_data(ptr->content,
				    ptr->region.r_size);
				curwp->w_dotp = lp;
				curwp->w_doto = offset;
				break;
			case DELREG:
				region_put_data(ptr->content,
				    ptr->region.r_size);
				break;
			case BOUNDARY:
				done = 1;
				break;
			case MODIFIED:
				curbp->b_flag &= ~BFCHG;
				break;
			default:
				break;
			}

			/* And move to next record */
			ptr = TAILQ_NEXT(ptr, next);
		} while (ptr != NULL && !done);

		boundary_flag = save;
		undo_add_boundary(FFRAND, 1);

		ewprintf("Undo!");
	}

	curbp->b_undoptr = ptr;

	return (rval);
}